

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

size_t mi_debug_show_bitmap
                 (char *prefix,char *header,size_t block_count,mi_bitmap_field_t *fields,
                 size_t field_count)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  size_t sVar5;
  size_t i;
  mi_bitmap_field_t *pmVar6;
  bool bVar7;
  char buf [65];
  
  _mi_message("%s%s:\n","  ",prefix);
  sVar5 = 0;
  lVar4 = 0;
  for (pmVar6 = (mi_bitmap_field_t *)0x0; pmVar6 != fields;
      pmVar6 = (mi_bitmap_field_t *)((long)pmVar6 + 1)) {
    uVar1 = *(ulong *)(block_count + (long)pmVar6 * 8);
    for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
      cVar3 = ' ';
      if ((char *)(lVar4 + uVar2) < header) {
        bVar7 = (uVar1 >> (uVar2 & 0x3f) & 1) != 0;
        cVar3 = '.';
        if (bVar7) {
          cVar3 = 'x';
        }
        sVar5 = sVar5 + bVar7;
      }
      buf[uVar2] = cVar3;
    }
    lVar4 = lVar4 + 0x40;
    buf[0x40] = '\0';
    _mi_message("%s  %s\n","  ",buf);
  }
  _mi_message("%s  total (\'x\'): %zu\n","  ",sVar5);
  return sVar5;
}

Assistant:

static size_t mi_debug_show_bitmap(const char* prefix, const char* header, size_t block_count, mi_bitmap_field_t* fields, size_t field_count ) {
  _mi_message("%s%s:\n", prefix, header);
  size_t bcount = 0;
  size_t inuse_count = 0;
  for (size_t i = 0; i < field_count; i++) {
    char buf[MI_BITMAP_FIELD_BITS + 1];
    uintptr_t field = mi_atomic_load_relaxed(&fields[i]);
    for (size_t bit = 0; bit < MI_BITMAP_FIELD_BITS; bit++, bcount++) {
      if (bcount < block_count) {
        bool inuse = ((((uintptr_t)1 << bit) & field) != 0);
        if (inuse) inuse_count++;
        buf[bit] = (inuse ? 'x' : '.');
      }
      else {
        buf[bit] = ' ';
      }
    }
    buf[MI_BITMAP_FIELD_BITS] = 0;
    _mi_message("%s  %s\n", prefix, buf);
  }
  _mi_message("%s  total ('x'): %zu\n", prefix, inuse_count);
  return inuse_count;
}